

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O2

int ON_SubDSectorId::Compare(ON_SubDSectorId lhs,ON_SubDSectorId rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  if (lhs.m_vertex_id < rhs.m_vertex_id) {
    return iVar1;
  }
  iVar2 = 1;
  if (lhs.m_vertex_id <= rhs.m_vertex_id) {
    if (lhs.m_minimum_face_id < rhs.m_minimum_face_id) {
      return iVar1;
    }
    if ((lhs.m_minimum_face_id <= rhs.m_minimum_face_id) &&
       (iVar2 = iVar1, rhs.m_sector_face_count <= lhs.m_sector_face_count)) {
      return (int)(rhs.m_sector_face_count < lhs.m_sector_face_count);
    }
  }
  return iVar2;
}

Assistant:

int ON_SubDSectorId::Compare(ON_SubDSectorId lhs, ON_SubDSectorId rhs)
{
  if (lhs.m_vertex_id < rhs.m_vertex_id)
    return -1;
  if (lhs.m_vertex_id > rhs.m_vertex_id)
    return 1;
  if (lhs.m_minimum_face_id < rhs.m_minimum_face_id)
    return -1;
  if (lhs.m_minimum_face_id > rhs.m_minimum_face_id)
    return 1;
  if (lhs.m_sector_face_count < rhs.m_sector_face_count)
    return -1;
  if (lhs.m_sector_face_count > rhs.m_sector_face_count)
    return 1;
  return 0;
}